

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_Data_PDU::Minefield_Data_PDU
          (Minefield_Data_PDU *this,EntityIdentifier *MinefieldID,
          EntityIdentifier *RequestingSimulationID,KUINT16 SeqNum,KUINT8 RequestID,KUINT8 PduSeqNum,
          KUINT8 NumPdus,MinefieldDataFilter *DF,EntityType *MineType)

{
  KUINT8 PduSeqNum_local;
  KUINT8 RequestID_local;
  KUINT16 SeqNum_local;
  EntityIdentifier *RequestingSimulationID_local;
  EntityIdentifier *MinefieldID_local;
  Minefield_Data_PDU *this_local;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Data_PDU_0032c070;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID,RequestingSimulationID);
  this->m_ui8ReqID = RequestID;
  this->m_ui8PduSeqNum = PduSeqNum;
  this->m_ui8NumPdus = NumPdus;
  this->m_ui8NumMines = '\0';
  this->m_ui8NumSensTyp = '\0';
  this->m_ui8Padding1 = '\0';
  DATA_TYPE::MinefieldDataFilter::MinefieldDataFilter(&this->m_DataFilter,DF);
  DATA_TYPE::EntityType::EntityType(&this->m_MineTyp,MineType);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16SensorTypes);
  std::vector<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>::vector
            (&this->m_vMines);
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '\'';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x2c;
  (this->m_SeqNumUnion).m_ui16SeqNum = (this->m_SeqNumUnion).m_ui16SeqNum & 1 | SeqNum << 1;
  DATA_TYPE::EntityIdentifier::operator=(&(this->super_Minefield_Header).m_MinefieldID,MinefieldID);
  return;
}

Assistant:

Minefield_Data_PDU::Minefield_Data_PDU( const EntityIdentifier & MinefieldID, const EntityIdentifier & RequestingSimulationID,
                                        KUINT16 SeqNum, KUINT8 RequestID, KUINT8 PduSeqNum, KUINT8 NumPdus,
                                        const MinefieldDataFilter & DF, const EntityType & MineType ) :
    m_ReqID( RequestingSimulationID ),
    m_ui8ReqID( RequestID ),
    m_ui8PduSeqNum( PduSeqNum ),
    m_ui8NumPdus( NumPdus ),
    m_DataFilter( DF ),
    m_MineTyp( MineType ),
    m_ui8NumMines( 0 ),
    m_ui8NumSensTyp( 0 ),
    m_ui8Padding1( 0 )
{
    m_ui8PDUType = MinefieldData_PDU_Type;
    m_ui16PDULength = MINEFIELD_DATA_PDU_SIZE;
    m_SeqNumUnion.m_ui16SeqNum15 = SeqNum;
    m_MinefieldID = MinefieldID;
}